

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

SectionTracker *
Catch::TestCaseTracking::SectionTracker::acquire
          (TrackerContext *ctx,NameAndLocationRef *nameAndLocation)

{
  ITracker *this;
  SectionTracker *this_00;
  SectionTracker *temp;
  unique_ptr<Catch::TestCaseTracking::SectionTracker> newTracker;
  SectionTracker *local_80;
  string local_78;
  NameAndLocation local_58;
  ITracker *local_28;
  
  this = ctx->m_currentTracker;
  this_00 = (SectionTracker *)ITracker::findChild(this,nameAndLocation);
  if (this_00 == (SectionTracker *)0x0) {
    StringRef::operator_cast_to_string(&local_78,&nameAndLocation->name);
    local_58.name._M_dataplus._M_p = (pointer)&local_58.name.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      local_58.name.field_2._8_8_ = local_78.field_2._8_8_;
    }
    else {
      local_58.name._M_dataplus._M_p = local_78._M_dataplus._M_p;
    }
    local_58.name._M_string_length = local_78._M_string_length;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_58.location.file = (nameAndLocation->location).file;
    local_58.location.line = (nameAndLocation->location).line;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_28 = this;
    Detail::
    make_unique<Catch::TestCaseTracking::SectionTracker,Catch::TestCaseTracking::NameAndLocation,Catch::TestCaseTracking::TrackerContext&,Catch::TestCaseTracking::ITracker*>
              ((Detail *)&local_80,&local_58,ctx,&local_28);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    this_00 = local_80;
    local_80 = (SectionTracker *)0x0;
    local_58.name._M_dataplus._M_p = (pointer)this_00;
    std::
    vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>>>
    ::emplace_back<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>>
              ((vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>>>
                *)&this->m_children,(unique_ptr<Catch::TestCaseTracking::ITracker> *)&local_58);
    if ((SectionTracker *)local_58.name._M_dataplus._M_p != (SectionTracker *)0x0) {
      (**(code **)(*(long *)local_58.name._M_dataplus._M_p + 8))();
    }
    if (local_80 != (SectionTracker *)0x0) {
      (*(local_80->super_TrackerBase).super_ITracker._vptr_ITracker[1])();
    }
  }
  if (ctx->m_runState != CompletedCycle) {
    tryOpen(this_00);
  }
  return this_00;
}

Assistant:

SectionTracker& SectionTracker::acquire( TrackerContext& ctx, NameAndLocationRef const& nameAndLocation ) {
        SectionTracker* tracker;

        ITracker& currentTracker = ctx.currentTracker();
        if ( ITracker* childTracker =
                 currentTracker.findChild( nameAndLocation ) ) {
            assert( childTracker );
            assert( childTracker->isSectionTracker() );
            tracker = static_cast<SectionTracker*>( childTracker );
        } else {
            auto newTracker = Catch::Detail::make_unique<SectionTracker>(
                NameAndLocation{ static_cast<std::string>(nameAndLocation.name),
                                 nameAndLocation.location },
                ctx,
                &currentTracker );
            tracker = newTracker.get();
            currentTracker.addChild( CATCH_MOVE( newTracker ) );
        }

        if ( !ctx.completedCycle() ) {
            tracker->tryOpen();
        }

        return *tracker;
    }